

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockDataSizeTestCase::iterate
          (InterfaceBlockDataSizeTestCase *this)

{
  Storage SVar1;
  RenderContext *renderCtx;
  TestLog *log;
  Shader *pSVar2;
  long lVar3;
  __type_conflict _Var4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar8;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar9;
  ProgramInterface interface;
  Program *pPVar10;
  char *nameWithPath;
  char *description;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar12;
  int dataSize;
  long lVar13;
  int ndx;
  long lVar14;
  allocator<char> local_301;
  undefined4 local_300;
  int local_2fc;
  long local_2f8;
  long local_2f0;
  ScopedLogSection section;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  GLint queryDataSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  GLenum prop;
  undefined4 uStack_27c;
  ostringstream local_278 [376];
  ShaderProgram program;
  undefined4 extraout_var_00;
  
  SVar1 = (this->super_InterfaceBlockBaseCase).m_storage;
  interface = (SVar1 != STORAGE_BUFFER) + PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
  pPVar10 = (Program *)&DAT_00000001;
  if (SVar1 != STORAGE_UNIFORM) {
    pPVar10 = (Program *)(ulong)interface;
  }
  local_300 = *(undefined4 *)
               (Functional::(anonymous_namespace)::
                getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
               (long)pPVar10 * 4);
  getProgramInterfaceResourceList_abi_cxx11_
            (&blockNames,(Functional *)(this->super_InterfaceBlockBaseCase).m_program,pPVar10,
             interface);
  renderCtx = ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&prop,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&prop);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&prop);
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pPVar10 = (this->super_InterfaceBlockBaseCase).m_program;
  iVar5 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  checkAndLogProgram(&program,pPVar10,(Functions *)CONCAT44(extraout_var,iVar5),
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  lVar12 = 0;
  do {
    if ((int)((ulong)((long)blockNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)blockNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar12) {
      glu::ShaderProgram::~ShaderProgram(&program);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&blockNames);
      return STOP;
    }
    log = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
          m_testCtx)->m_log;
    local_2f0 = lVar12;
    std::__cxx11::string::string<std::allocator<char>>((string *)&prop,"Block",&local_301);
    local_2f8 = local_2f0 * 0x20;
    std::operator+(&local_2a0,"Block \"",
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &queryDataSize,&local_2a0,"\"");
    tcu::ScopedLogSection::ScopedLogSection
              (&section,log,(string *)&prop,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queryDataSize);
    std::__cxx11::string::~string((string *)&queryDataSize);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&prop);
    iVar5 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar12 = local_2f8;
    lVar8 = CONCAT44(extraout_var_00,iVar5);
    local_2fc = (**(code **)(lVar8 + 0x9a8))
                          (program.m_program.m_program,local_300,
                           *(undefined8 *)
                            ((long)&((blockNames.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_2f8));
    glu::parseVariableName_abi_cxx11_
              ((string *)&prop,
               *(glu **)((long)&((blockNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar12),nameWithPath);
    lVar12 = 0;
    for (lVar13 = 0;
        pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                           ((this->super_InterfaceBlockBaseCase).m_program),
        pSVar2 = *(pvVar9->
                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        lVar13 < (int)(((long)(pSVar2->m_defaultBlock).interfaceBlocks.
                              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&(pSVar2->m_defaultBlock).interfaceBlocks.
                                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                 ._M_impl.super__Vector_impl_data) / 0x90); lVar13 = lVar13 + 1) {
      pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                         ((this->super_InterfaceBlockBaseCase).m_program);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop;
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&((*(pvVar9->
                                            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                         m_defaultBlock).interfaceBlocks.
                                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                         ._M_impl.super__Vector_impl_data + lVar12 + 0x20),__rhs);
      if ((_Var4) &&
         (pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                             ((this->super_InterfaceBlockBaseCase).m_program),
         *(Storage *)
          (*(long *)&((*(pvVar9->
                        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).interfaceBlocks
                     .super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                     _M_impl.super__Vector_impl_data + 0x14 + lVar12) ==
         (this->super_InterfaceBlockBaseCase).m_storage)) {
        pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                           ((this->super_InterfaceBlockBaseCase).m_program);
        lVar13 = *(long *)&((*(pvVar9->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                           interfaceBlocks.
                           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                           ._M_impl.super__Vector_impl_data;
        lVar11 = 0x20;
        iVar5 = 0;
        for (lVar14 = 0; lVar3 = *(long *)(lVar13 + 0x60 + lVar12),
            lVar14 < (int)((*(long *)(lVar13 + 0x68 + lVar12) - lVar3) / 0x60); lVar14 = lVar14 + 1)
        {
          iVar6 = getVarTypeSize((anon_unknown_0 *)(lVar3 + lVar11),(VarType *)__rhs);
          iVar5 = iVar5 + iVar6;
          lVar11 = lVar11 + 0x60;
        }
        goto LAB_012f2947;
      }
      lVar12 = lVar12 + 0x90;
    }
    iVar5 = -1;
LAB_012f2947:
    std::__cxx11::string::~string((string *)&prop);
    queryDataSize = -1;
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x835);
    if (local_2fc == -1) {
      _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_278);
      std::operator<<((ostream *)local_278,
                      "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"");
      std::operator<<((ostream *)local_278,
                      (string *)
                      ((long)&((blockNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_2f8));
      std::operator<<((ostream *)local_278,"\"");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_278);
      description = "Resource not found";
LAB_012f2b2e:
      tcu::TestContext::setTestResult
                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,description);
    }
    else {
      prop = 0x9303;
      (**(code **)(lVar8 + 0x9c8))(program.m_program.m_program,local_300,local_2fc,1,&prop,1,0);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"query resource BUFFER_DATA_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x843);
      _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_278);
      std::operator<<((ostream *)local_278,"BUFFER_DATA_SIZE = ");
      std::ostream::operator<<(local_278,queryDataSize);
      std::operator<<((ostream *)local_278,"\n");
      std::operator<<((ostream *)local_278,"Buffer data size with tight packing: ");
      std::ostream::operator<<(local_278,iVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_278);
      if (queryDataSize < iVar5) {
        _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_278);
        std::operator<<((ostream *)local_278,
                        "Error, buffer size was less than minimum buffer data size");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_278);
        description = "Buffer data size invalid";
        goto LAB_012f2b2e;
      }
      _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_278);
      std::operator<<((ostream *)local_278,"Buffer size valid");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_278);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar12 = local_2f0 + 1;
  } while( true );
}

Assistant:

InterfaceBlockDataSizeTestCase::IterateResult InterfaceBlockDataSizeTestCase::iterate (void)
{
	const ProgramInterface			programInterface		= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
															  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
															  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue	= getProgramInterfaceGLEnum(programInterface);
	const std::vector<std::string>	blockNames				= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program					(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks
	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		const int					expectedMinDataSize	= getBlockMinDataSize(blockNames[blockNdx]);
		glw::GLint					queryDataSize		= -1;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query
		{
			const glw::GLenum prop = GL_BUFFER_DATA_SIZE;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, 1, &prop, 1, DE_NULL, &queryDataSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource BUFFER_DATA_SIZE");
		}

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "BUFFER_DATA_SIZE = " << queryDataSize << "\n"
			<< "Buffer data size with tight packing: " << expectedMinDataSize
			<< tcu::TestLog::EndMessage;

		if (queryDataSize < expectedMinDataSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was less than minimum buffer data size" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer data size invalid");
			continue;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Buffer size valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}